

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O3

HSQOBJECT __thiscall squall::detail::KlassImp<Foo>::make_accessor_table(KlassImp<Foo> *this)

{
  HSQOBJECT HVar1;
  HSQOBJECT tableobj;
  HSQOBJECT local_20;
  
  sq_newtable(this->vm_);
  sq_getstackobj(this->vm_,-1,&local_20);
  sq_addref(this->vm_,&local_20);
  sq_pop(this->vm_,1);
  HVar1._4_4_ = 0;
  HVar1._type = local_20._type;
  HVar1._unVal.pTable = local_20._unVal.pTable;
  return HVar1;
}

Assistant:

HSQOBJECT make_accessor_table() {
        HSQOBJECT tableobj;
        sq_newtable(vm_);
        sq_getstackobj(vm_, -1, &tableobj);
        sq_addref(vm_, &tableobj);
        sq_pop(vm_, 1);
        return tableobj;
    }